

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvaxttime.c
# Opt level: O1

int main(int argc,char **argv)

{
  uint uVar1;
  void *pvVar2;
  nva_card *pnVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  undefined1 auVar7 [16];
  int cnum;
  timeval start;
  timeval end;
  int local_54;
  timeval local_50;
  timeval local_40;
  
  iVar4 = nva_init();
  if (iVar4 == 0) {
    local_54 = 0;
    do {
      while (iVar4 = getopt(argc,argv,"c:"), iVar4 == 99) {
        __isoc99_sscanf(_optarg,"%d",&local_54);
      }
    } while (iVar4 != -1);
    if (local_54 < nva_cardsnum) {
      pvVar2 = nva_cards[local_54].bar0;
      *(undefined4 *)((long)pvVar2 + 0x200) = 0x40110011;
      *(undefined4 *)((long)pvVar2 + 0x200) = 0xffffffff;
      usleep(1000);
      pnVar3 = nva_cards;
      pvVar2 = nva_cards[local_54].bar0;
      *(undefined4 *)((long)pvVar2 + 0x1700) = 0x10;
      *(undefined4 *)((long)pvVar2 + 0x701080) = 0x190000;
      *(undefined4 *)((long)pvVar2 + 0x701084) = 0x2fffff;
      *(undefined4 *)((long)pvVar2 + 0x701088) = 0x200000;
      *(undefined4 *)((long)pvVar2 + 0x70108c) = 0;
      *(undefined4 *)((long)pvVar2 + 0x701090) = 0;
      *(undefined4 *)((long)pvVar2 + 0x701094) = 0;
      *(undefined4 *)((long)pvVar2 + 0x1700) = 0x20;
      uVar5 = 0xfffffffffffffffc;
      do {
        *(undefined4 *)((long)pnVar3[local_54].bar0 + uVar5 + 0x700004) = 0xffff06;
        uVar5 = uVar5 + 4;
      } while (uVar5 < 0xffffc);
      lVar6 = 0;
      do {
        *(undefined4 *)((long)pnVar3[local_54].bar0 + lVar6 + 0x700000) =
             *(undefined4 *)((long)code + lVar6);
        lVar6 = lVar6 + 4;
      } while (lVar6 != 0x38);
      pvVar2 = pnVar3[local_54].bar0;
      *(undefined4 *)((long)pvVar2 + 0x70000) = 1;
      do {
      } while (*(int *)((long)pvVar2 + 0x70000) != 0);
      usleep(1000);
      pnVar3 = nva_cards;
      pvVar2 = nva_cards[local_54].bar0;
      *(undefined4 *)((long)pvVar2 + 0x103d10) = 0x1fffffff;
      *(undefined4 *)((long)pvVar2 + 0x103d08) = 0xfffffff;
      *(undefined4 *)((long)pvVar2 + 0x103d28) = 0x90044;
      *(undefined4 *)((long)pvVar2 + 0x103cc0) = 0x2000;
      *(undefined4 *)((long)pvVar2 + 0x103cc4) = 0x1c;
      *(undefined4 *)((long)pvVar2 + 0x103cc8) = 0x400;
      *(undefined4 *)((long)pvVar2 + 0x103ce4) = 0;
      *(undefined4 *)((long)pvVar2 + 0x103ce8) = 0xf;
      *(undefined4 *)((long)pvVar2 + 0x103cec) = 0x404;
      *(undefined4 *)((long)pvVar2 + 0x103c20) = 0x3f;
      *(undefined4 *)((long)pvVar2 + 0x103d84) = 0x3f;
      *(uint *)((long)pvVar2 + 0x1588) = *(uint *)((long)pvVar2 + 0x1588) & 0xffff0000;
      *(undefined4 *)((long)pvVar2 + 0x2500) = 1;
      *(undefined4 *)((long)pvVar2 + 0x3200) = 1;
      *(undefined4 *)((long)pvVar2 + 0x3250) = 1;
      *(undefined4 *)((long)pvVar2 + 0x1700) = 0x10;
      *(undefined4 *)((long)pvVar2 + 0x700f00) = 0;
      *(undefined4 *)((long)pvVar2 + 0x700f04) = 0;
      *(undefined4 *)((long)pvVar2 + 0x700f08) = 0;
      *(undefined4 *)((long)pvVar2 + 0x700f0c) = 0;
      *(undefined4 *)((long)pvVar2 + 0x700f10) = 0;
      *(undefined4 *)((long)pvVar2 + 0x700f14) = 0;
      *(undefined4 *)((long)pvVar2 + 0x700f18) = 0;
      *(undefined4 *)((long)pvVar2 + 0x700f1c) = 0;
      *(undefined4 *)((long)pvVar2 + 0x700f20) = 0;
      *(undefined4 *)((long)pvVar2 + 0x700f24) = 0;
      *(undefined4 *)((long)pvVar2 + 0x700f28) = 0;
      *(undefined4 *)((long)pvVar2 + 0x700f2c) = 0;
      *(undefined4 *)((long)pvVar2 + 0x700f30) = 0;
      *(undefined4 *)((long)pvVar2 + 0x700f34) = 0;
      *(undefined4 *)((long)pvVar2 + 0x700f38) = 0;
      *(undefined4 *)((long)pvVar2 + 0x700f3c) = 0x403f6078;
      *(undefined4 *)((long)pvVar2 + 0x700f40) = 0;
      *(undefined4 *)((long)pvVar2 + 0x700f44) = 0x2101ffff;
      *(undefined4 *)((long)pvVar2 + 0x700f48) = 0x10;
      *(undefined4 *)((long)pvVar2 + 0x700f4c) = 0;
      *(undefined4 *)((long)pvVar2 + 0x700f50) = 0x110000;
      *(undefined4 *)((long)pvVar2 + 0x700f54) = 0x80000;
      *(undefined4 *)((long)pvVar2 + 0x700f58) = 0;
      *(undefined4 *)((long)pvVar2 + 0x700f5c) = 0;
      *(undefined4 *)((long)pvVar2 + 0x700f60) = 0;
      *(undefined4 *)((long)pvVar2 + 0x700f64) = 0;
      *(undefined4 *)((long)pvVar2 + 0x700f68) = 0;
      *(undefined4 *)((long)pvVar2 + 0x700f6c) = 0;
      *(undefined4 *)((long)pvVar2 + 0x700f70) = 0;
      *(undefined4 *)((long)pvVar2 + 0x700f74) = 0;
      *(undefined4 *)((long)pvVar2 + 0x700f78) = 0;
      *(undefined4 *)((long)pvVar2 + 0x700f7c) = 0x30000fff;
      *(undefined4 *)((long)pvVar2 + 0x700f80) = 0x4000600;
      *(undefined4 *)((long)pvVar2 + 0x700f84) = 0;
      *(undefined4 *)((long)pvVar2 + 0x700f88) = 0x410;
      *(undefined4 *)((long)pvVar2 + 0x700f8c) = 0;
      *(undefined4 *)((long)pvVar2 + 0x700f90) = 0;
      *(undefined4 *)((long)pvVar2 + 0x700f94) = 0;
      *(undefined4 *)((long)pvVar2 + 0x700f98) = 0x101;
      *(undefined4 *)((long)pvVar2 + 0x700e00) = 0;
      *(undefined4 *)((long)pvVar2 + 0x700e04) = 0;
      *(undefined4 *)((long)pvVar2 + 0x700e08) = 0;
      *(undefined4 *)((long)pvVar2 + 0x700e0c) = 0;
      *(undefined4 *)((long)pvVar2 + 0x700e10) = 0;
      *(undefined4 *)((long)pvVar2 + 0x700e14) = 0;
      *(undefined4 *)((long)pvVar2 + 0x700e18) = 0;
      *(undefined4 *)((long)pvVar2 + 0x700e1c) = 0;
      *(undefined4 *)((long)pvVar2 + 0x700e20) = 0;
      *(undefined4 *)((long)pvVar2 + 0x700e24) = 0;
      *(undefined4 *)((long)pvVar2 + 0x700e28) = 0;
      *(undefined4 *)((long)pvVar2 + 0x700e2c) = 0;
      *(undefined4 *)((long)pvVar2 + 0x700e30) = 0;
      *(undefined4 *)((long)pvVar2 + 0x700e34) = 0;
      *(undefined4 *)((long)pvVar2 + 0x700e38) = 0;
      *(undefined4 *)((long)pvVar2 + 0x700e3c) = 0x403f6078;
      *(undefined4 *)((long)pvVar2 + 0x700e40) = 0;
      *(undefined4 *)((long)pvVar2 + 0x700e44) = 0x2101ffff;
      *(undefined4 *)((long)pvVar2 + 0x700e48) = 0x10;
      *(undefined4 *)((long)pvVar2 + 0x700e4c) = 0;
      *(undefined4 *)((long)pvVar2 + 0x700e50) = 0x110000;
      *(undefined4 *)((long)pvVar2 + 0x700e54) = 0x80000;
      *(undefined4 *)((long)pvVar2 + 0x700e58) = 0;
      *(undefined4 *)((long)pvVar2 + 0x700e5c) = 0;
      *(undefined4 *)((long)pvVar2 + 0x700e60) = 0;
      *(undefined4 *)((long)pvVar2 + 0x700e64) = 0;
      *(undefined4 *)((long)pvVar2 + 0x700e68) = 0;
      *(undefined4 *)((long)pvVar2 + 0x700e6c) = 0;
      *(undefined4 *)((long)pvVar2 + 0x700e70) = 0;
      *(undefined4 *)((long)pvVar2 + 0x700e74) = 0;
      *(undefined4 *)((long)pvVar2 + 0x700e78) = 0;
      *(undefined4 *)((long)pvVar2 + 0x700e7c) = 0x30000fff;
      *(undefined4 *)((long)pvVar2 + 0x700e80) = 0x4000600;
      *(undefined4 *)((long)pvVar2 + 0x700e84) = 0;
      *(undefined4 *)((long)pvVar2 + 0x700e88) = 0x410;
      *(undefined4 *)((long)pvVar2 + 0x700e8c) = 0;
      *(undefined4 *)((long)pvVar2 + 0x700e90) = 0;
      *(undefined4 *)((long)pvVar2 + 0x700e94) = 0;
      *(undefined4 *)((long)pvVar2 + 0x700e98) = 0x101;
      uVar5 = 0xfffffffffffffffc;
      do {
        *(undefined4 *)((long)pnVar3[local_54].bar0 + uVar5 + 0x706004) = 0;
        uVar5 = uVar5 + 4;
      } while (uVar5 < 0xffd);
      pvVar2 = pnVar3[local_54].bar0;
      *(undefined4 *)((long)pvVar2 + 0x707008) = 1;
      *(undefined4 *)((long)pvVar2 + 0x70700c) = 0x600004;
      *(undefined4 *)((long)pvVar2 + 0x701100) = 0x19003d;
      *(undefined4 *)((long)pvVar2 + 0x701104) = 0xffffffff;
      pvVar2 = nva_cards[local_54].bar0;
      *(undefined4 *)((long)pvVar2 + 0x701108) = 0;
      *(undefined4 *)((long)pvVar2 + 0x70110c) = 0;
      *(undefined4 *)((long)pvVar2 + 0x701110) = 0;
      *(undefined4 *)((long)pvVar2 + 0x701114) = 0;
      *(undefined4 *)((long)pvVar2 + 0x709000) = 1;
      *(undefined4 *)((long)pvVar2 + 0x70000) = 1;
      do {
      } while (*(int *)((long)pvVar2 + 0x70000) != 0);
      *(undefined4 *)((long)pvVar2 + 0x2600) = 0x8000100d;
      *(undefined4 *)((long)pvVar2 + 0x2604) = 0xc000100f;
      *(undefined4 *)((long)pvVar2 + 0x27fc) = 0x8000100e;
      *(undefined4 *)((long)pvVar2 + 0x32f4) = 0x109;
      *(undefined4 *)((long)pvVar2 + 0x32ec) = 1;
      *(undefined4 *)((long)pvVar2 + 0x2500) = 0x101;
      *(undefined4 *)((long)pvVar2 + 0x720000) = 0x40000;
      *(undefined4 *)((long)pvVar2 + 0x720004) = 1;
      *(undefined4 *)((long)pvVar2 + 0x710000) = 0x120000;
      *(undefined4 *)((long)pvVar2 + 0x710004) = 0x8000;
      *(undefined4 *)((long)pvVar2 + 0x70000) = 1;
      do {
      } while (*(int *)((long)pvVar2 + 0x70000) != 0);
      *(undefined4 *)((long)pvVar2 + 0xc0208c) = 1;
      usleep(1000);
      do {
        uVar1 = *(uint *)((long)nva_cards[local_54].bar0 + 0x103ddc);
      } while (uVar1 < 10000000);
      gettimeofday(&local_50,(__timezone_ptr_t)0x0);
      do {
      } while (*(int *)((long)nva_cards[local_54].bar0 + 0x103ddc) - uVar1 < 10000000);
      gettimeofday(&local_40,(__timezone_ptr_t)0x0);
      lVar6 = (local_40.tv_usec - local_50.tv_usec) + (local_40.tv_sec - local_50.tv_sec) * 1000000;
      auVar7._8_4_ = (int)((ulong)lVar6 >> 0x20);
      auVar7._0_8_ = lVar6;
      auVar7._12_4_ = 0x45300000;
      printf("%s\'s clock: frequency       = %f MHz\n",
             10000000.0 /
             ((auVar7._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0)),"PBSP");
      return 0;
    }
    if (nva_cardsnum == 0) {
      main_cold_3();
    }
    else {
      main_cold_2();
    }
  }
  else {
    main_cold_1();
  }
  return 1;
}

Assistant:

int main(int argc, char **argv) {
	if (nva_init()) {
		fprintf (stderr, "PCI init failure!\n");
		return 1;
	}
	int c;
	int cnum =0;
	while ((c = getopt (argc, argv, "c:")) != -1)
		switch (c) {
			case 'c':
				sscanf(optarg, "%d", &cnum);
				break;
		}
	if (cnum >= nva_cardsnum) {
		if (nva_cardsnum)
			fprintf (stderr, "No such card.\n");
		else
			fprintf (stderr, "No cards found.\n");
		return 1;
	}
	int32_t i;
	nva_wr32(cnum, 0x200, 0x40110011);
	nva_wr32(cnum, 0x200, 0xffffffff);
	usleep(1000);
	nva_wr32(cnum, 0x1700, 0x10);
	nva_wr32(cnum, 0x701080, 0x00190000);
	nva_wr32(cnum, 0x701084, 0x002fffff);
	nva_wr32(cnum, 0x701088, 0x00200000);
	nva_wr32(cnum, 0x70108c, 0x00000000);
	nva_wr32(cnum, 0x701090, 0x00000000);
	nva_wr32(cnum, 0x701094, 0x00000000);
	nva_wr32(cnum, 0x1700, 0x20);
	for (i = 0; i < 0x100000; i+= 4)
		nva_wr32(cnum, 0x700000 + i, 0xffff06);
	for (i = 0; i < sizeof(code) / 4; i++) {
		nva_wr32(cnum, 0x700000 + i * 4, code[i]);
	}
	nva_wr32(cnum, 0x70000, 1);
	while (nva_rd32(cnum, 0x70000));
	usleep(1000);
	nva_wr32(cnum, 0x103d10, 0x1fffffff);
	nva_wr32(cnum, 0x103d08, 0xfffffff);
	nva_wr32(cnum, 0x103d28, 0x90044);
	nva_wr32(cnum, 0x103cc0, 0x2000);
	nva_wr32(cnum, 0x103cc4, 0x1c);
	nva_wr32(cnum, 0x103cc8, 0x400);
	nva_wr32(cnum, 0x103ce4, 0x0000);
	nva_wr32(cnum, 0x103ce8, 0x0f);
	nva_wr32(cnum, 0x103cec, 0x404);
	nva_wr32(cnum, 0x103c20, 0x3f);
	nva_wr32(cnum, 0x103d84, 0x3f);
	nva_wr32(cnum, 0x1588, nva_rd32(cnum, 0x1588) & ~0xffff);
	nva_wr32(cnum, 0x2500, 1);
	nva_wr32(cnum, 0x3200, 1);
	nva_wr32(cnum, 0x3250, 1);
	nva_wr32(cnum, 0x1700, 0x10);
	nva_wr32(cnum, 0x700000+0xf00, 0);
	nva_wr32(cnum, 0x700000+0xf04, 0);
	nva_wr32(cnum, 0x700000+0xf08, 0);
	nva_wr32(cnum, 0x700000+0xf0c, 0);
	nva_wr32(cnum, 0x700000+0xf10, 0);
	nva_wr32(cnum, 0x700000+0xf14, 0);
	nva_wr32(cnum, 0x700000+0xf18, 0);
	nva_wr32(cnum, 0x700000+0xf1c, 0);
	nva_wr32(cnum, 0x700000+0xf20, 0);
	nva_wr32(cnum, 0x700000+0xf24, 0);
	nva_wr32(cnum, 0x700000+0xf28, 0);
	nva_wr32(cnum, 0x700000+0xf2c, 0);
	nva_wr32(cnum, 0x700000+0xf30, 0);
	nva_wr32(cnum, 0x700000+0xf34, 0);
	nva_wr32(cnum, 0x700000+0xf38, 0);
	nva_wr32(cnum, 0x700000+0xf3c, 0x403f6078);
	nva_wr32(cnum, 0x700000+0xf40, 0);
	nva_wr32(cnum, 0x700000+0xf44, 0x2101ffff);
	nva_wr32(cnum, 0x700000+0xf48, 0x10);
	nva_wr32(cnum, 0x700000+0xf4c, 0);
	nva_wr32(cnum, 0x700000+0xf50, 0x110000);
	nva_wr32(cnum, 0x700000+0xf54, 0x80000);
	nva_wr32(cnum, 0x700000+0xf58, 0);
	nva_wr32(cnum, 0x700000+0xf5c, 0);
	nva_wr32(cnum, 0x700000+0xf60, 0);
	nva_wr32(cnum, 0x700000+0xf64, 0);
	nva_wr32(cnum, 0x700000+0xf68, 0);
	nva_wr32(cnum, 0x700000+0xf6c, 0);
	nva_wr32(cnum, 0x700000+0xf70, 0);
	nva_wr32(cnum, 0x700000+0xf74, 0);
	nva_wr32(cnum, 0x700000+0xf78, 0);
	nva_wr32(cnum, 0x700000+0xf7c, 0x30000fff);
	nva_wr32(cnum, 0x700000+0xf80, 0x4000600);
	nva_wr32(cnum, 0x700000+0xf84, 0);
	nva_wr32(cnum, 0x700000+0xf88, 0x410);
	nva_wr32(cnum, 0x700000+0xf8c, 0);
	nva_wr32(cnum, 0x700000+0xf90, 0);
	nva_wr32(cnum, 0x700000+0xf94, 0);
	nva_wr32(cnum, 0x700000+0xf98, 0x101);

	nva_wr32(cnum, 0x700000+0xe00, 0);
	nva_wr32(cnum, 0x700000+0xe04, 0);
	nva_wr32(cnum, 0x700000+0xe08, 0);
	nva_wr32(cnum, 0x700000+0xe0c, 0);
	nva_wr32(cnum, 0x700000+0xe10, 0);
	nva_wr32(cnum, 0x700000+0xe14, 0);
	nva_wr32(cnum, 0x700000+0xe18, 0);
	nva_wr32(cnum, 0x700000+0xe1c, 0);
	nva_wr32(cnum, 0x700000+0xe20, 0);
	nva_wr32(cnum, 0x700000+0xe24, 0);
	nva_wr32(cnum, 0x700000+0xe28, 0);
	nva_wr32(cnum, 0x700000+0xe2c, 0);
	nva_wr32(cnum, 0x700000+0xe30, 0);
	nva_wr32(cnum, 0x700000+0xe34, 0);
	nva_wr32(cnum, 0x700000+0xe38, 0);
	nva_wr32(cnum, 0x700000+0xe3c, 0x403f6078);
	nva_wr32(cnum, 0x700000+0xe40, 0);
	nva_wr32(cnum, 0x700000+0xe44, 0x2101ffff);
	nva_wr32(cnum, 0x700000+0xe48, 0x10);
	nva_wr32(cnum, 0x700000+0xe4c, 0);
	nva_wr32(cnum, 0x700000+0xe50, 0x110000);
	nva_wr32(cnum, 0x700000+0xe54, 0x80000);
	nva_wr32(cnum, 0x700000+0xe58, 0);
	nva_wr32(cnum, 0x700000+0xe5c, 0);
	nva_wr32(cnum, 0x700000+0xe60, 0);
	nva_wr32(cnum, 0x700000+0xe64, 0);
	nva_wr32(cnum, 0x700000+0xe68, 0);
	nva_wr32(cnum, 0x700000+0xe6c, 0);
	nva_wr32(cnum, 0x700000+0xe70, 0);
	nva_wr32(cnum, 0x700000+0xe74, 0);
	nva_wr32(cnum, 0x700000+0xe78, 0);
	nva_wr32(cnum, 0x700000+0xe7c, 0x30000fff);
	nva_wr32(cnum, 0x700000+0xe80, 0x4000600);
	nva_wr32(cnum, 0x700000+0xe84, 0);
	nva_wr32(cnum, 0x700000+0xe88, 0x410);
	nva_wr32(cnum, 0x700000+0xe8c, 0);
	nva_wr32(cnum, 0x700000+0xe90, 0);
	nva_wr32(cnum, 0x700000+0xe94, 0);
	nva_wr32(cnum, 0x700000+0xe98, 0x101);
	for (i = 0; i <= 0x1000; i+= 4)
		nva_wr32(cnum, 0x700000+0x6000 + i, 0);
	nva_wr32(cnum, 0x700000+0x7008, 0x1);
	nva_wr32(cnum, 0x700000+0x700c, 0x00600004);
	nva_wr32(cnum, 0x700000+0x1100, 0x0019003d);
	nva_wr32(cnum, 0x700000+0x1104, 0xffffffff);
	nva_wr32(cnum, 0x700000+0x1108, 0);
	nva_wr32(cnum, 0x700000+0x110c, 0);
	nva_wr32(cnum, 0x700000+0x1110, 0);
	nva_wr32(cnum, 0x700000+0x1114, 0);
	nva_wr32(cnum, 0x700000+0x9000, 1);
	nva_wr32(cnum, 0x70000, 1);
	while (nva_rd32(cnum, 0x70000));
	nva_wr32(cnum, 0x2600, 0x8000100d);
	nva_wr32(cnum, 0x2604, 0xc000100f);
	nva_wr32(cnum, 0x27fc, 0x8000100e);
	nva_wr32(cnum, 0x32f4, 0x109);
	nva_wr32(cnum, 0x32ec, 0x1);
	nva_wr32(cnum, 0x2500, 0x101);
	nva_wr32(cnum, 0x700000+0x20000, 0x00040000);
	nva_wr32(cnum, 0x700000+0x20004, 0x00000001);
	nva_wr32(cnum, 0x700000+0x10000, 0x00120000);
	nva_wr32(cnum, 0x700000+0x10004, 0x00008000);
	nva_wr32(cnum, 0x70000, 1);
	while (nva_rd32(cnum, 0x70000));
	nva_wr32(cnum, 0xc0208c, 1);
	usleep(1000);
	struct timeval start, end;
	uint64_t t_start;
	/* Save the current values */
	do
	{
		t_start = nva_rd32(cnum, 0x103ddc);
	} while (t_start < 10000000);
	gettimeofday(&start, NULL);
	while ((uint32_t)(nva_rd32(cnum, 0x103ddc) - t_start) < 10000000);
	gettimeofday(&end, NULL);
	uint64_t val = time_diff_us(start, end);
	printf("%s's clock: frequency       = %f MHz\n", "PBSP", 10000000.0/val);
	return 0;
}